

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O1

void __thiscall RootWindow::closeExample(RootWindow *this)

{
  int iVar1;
  OpacityNode *pOVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  float *pfVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
  *this_02;
  undefined1 auVar5 [8];
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
  sequence;
  double local_48;
  shared_ptr<rengine::AbstractAnimation> local_40;
  
  if (this->m_example != (Example *)0x0) {
    animateButtons(this,this->m_example,1.5707964,0.0,0.3);
    auStack_78 = (undefined1  [8])0x0;
    sequence.
    super__Vector_base<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sequence.
    super__Vector_base<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00148c60;
    pOVar2 = this->m_appLayer;
    this_00[1]._M_use_count = 0;
    this_00[1]._M_weak_count = 0;
    *(undefined4 *)&this_00[2]._vptr__Sp_counted_base = 1;
    this_00[2]._M_use_count = 0;
    this_00[2]._M_weak_count = 0x3ff00000;
    *(byte *)&this_00[3]._vptr__Sp_counted_base = *(byte *)&this_00[3]._vptr__Sp_counted_base & 0xf8
    ;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Animation_00148cb0;
    *(OpacityNode **)&this_00[3]._M_use_count = pOVar2;
    this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[4]._M_use_count = 0;
    this_00[4]._M_weak_count = 0;
    this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_02 = (Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
               *)(this_00 + 1);
    this_00[2]._M_use_count = 0;
    this_00[2]._M_weak_count = 0x3fe00000;
    pfVar4 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(this_02,0.0);
    *pfVar4 = 1.0;
    pfVar4 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(this_02,1.0);
    *pfVar4 = 0.0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    this_01->_M_use_count = 1;
    this_01->_M_weak_count = 1;
    this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00148cf0;
    this_01[1]._M_use_count = 0;
    this_01[1]._M_weak_count = 0;
    *(undefined4 *)&this_01[2]._vptr__Sp_counted_base = 1;
    *(byte *)&this_01[3]._vptr__Sp_counted_base = *(byte *)&this_01[3]._vptr__Sp_counted_base & 0xf8
    ;
    this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SignalEmitter_00148d40;
    *(RootWindow **)&this_01[3]._M_use_count = this;
    this_01[2]._M_use_count = 0;
    this_01[2]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_02;
    local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_00;
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
    ::emplace_back<std::shared_ptr<rengine::AbstractAnimation>>
              ((vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
                *)auStack_78,&local_40);
    if (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this_01 + 1);
    local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_01;
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
    ::emplace_back<std::shared_ptr<rengine::AbstractAnimation>>
              ((vector<std::shared_ptr<rengine::AbstractAnimation>,std::allocator<std::shared_ptr<rengine::AbstractAnimation>>>
                *)auStack_78,&local_40);
    if (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar3 = sequence.
             super__Vector_base<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_78 !=
        (undefined1  [8])
        sequence.
        super__Vector_base<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_48 = 0.0;
      auVar5 = auStack_78;
      do {
        local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (((pointer)auVar5)->
             super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (((pointer)auVar5)->
             super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
        if (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_40.
                  super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_40.
                  super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        rengine::AnimationManager::start
                  (&(this->super_StandardSurface).m_animationManager,&local_40,local_48);
        iVar1 = (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m_iterations;
        if (-1 < iVar1) {
          local_48 = local_48 +
                     (double)iVar1 *
                     (local_40.
                      super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_duration;
        }
        if (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.
                     super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      } while ((-1 < iVar1) &&
              (auVar5 = (undefined1  [8])((long)auVar5 + 0x10), auVar5 != (undefined1  [8])psVar3));
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::~vector((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
               *)auStack_78);
    return;
  }
  __assert_fail("m_example",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                ,0x83,"void RootWindow::closeExample()");
}

Assistant:

void RootWindow::closeExample()
{
    assert(m_example);

    animateButtons(m_example, M_PI / 2.0f, 0, 0.3);

    std::vector<std::shared_ptr<AbstractAnimation>> sequence;

    auto fade = std::make_shared<Animation_OpacityNode_opacity>(m_appLayer);
    fade->setDuration(0.5);
    fade->newKeyFrame(0) = 1;
    fade->newKeyFrame(1) = 0;

    auto close = std::make_shared<Animation_Callback<RootWindow, &RootWindow::exampleClosed>>(this);

    sequence.push_back(fade);
    sequence.push_back(close);

    animationManager()->start(sequence, 0);
}